

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleRPathCheckCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  byte local_2d9;
  allocator local_2a1;
  string local_2a0;
  byte local_27b;
  byte local_27a;
  allocator local_279;
  string local_278;
  byte local_253;
  byte local_252;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream e;
  uint local_38;
  int local_34;
  uint i;
  Doing doing;
  char *rpath;
  char *file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  rpath = (char *)0x0;
  _i = (char *)0x0;
  local_34 = 0;
  local_38 = 1;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar2 <= local_38) {
      if (rpath == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_200,"RPATH_CHECK not given FILE option.",&local_201);
        cmCommand::SetError(&this->super_cmCommand,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
        this_local._7_1_ = false;
      }
      else if (_i == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_228,"RPATH_CHECK not given RPATH option.",&local_229);
        cmCommand::SetError(&this->super_cmCommand,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        this_local._7_1_ = false;
      }
      else {
        bVar1 = cmsys::SystemTools::FileExists(rpath,true);
        local_252 = 0;
        local_253 = 0;
        local_27a = 0;
        local_27b = 0;
        local_2d9 = 0;
        if (bVar1) {
          std::allocator<char>::allocator();
          local_252 = 1;
          std::__cxx11::string::string((string *)&local_250,rpath,&local_251);
          local_253 = 1;
          std::allocator<char>::allocator();
          local_27a = 1;
          std::__cxx11::string::string((string *)&local_278,_i,&local_279);
          local_27b = 1;
          bVar1 = cmSystemTools::CheckRPath(&local_250,&local_278);
          local_2d9 = bVar1 ^ 0xff;
        }
        if ((local_27b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_278);
        }
        if ((local_27a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_279);
        }
        if ((local_253 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_250);
        }
        if ((local_252 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_251);
        }
        if ((local_2d9 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2a0,rpath,&local_2a1);
          cmsys::SystemTools::RemoveFile(&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
        }
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_38);
    bVar1 = std::operator==(pvVar3,"RPATH");
    if (bVar1) {
      local_34 = 2;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_38);
      bVar1 = std::operator==(pvVar3,"FILE");
      if (bVar1) {
        local_34 = 1;
      }
      else {
        if (local_34 == 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](args,(ulong)local_38);
          rpath = (char *)std::__cxx11::string::c_str();
        }
        else {
          if (local_34 != 2) {
            std::__cxx11::ostringstream::ostringstream(local_1b0);
            poVar4 = std::operator<<((ostream *)local_1b0,"RPATH_CHECK given unknown argument ");
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_38);
            std::operator<<(poVar4,(string *)pvVar3);
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_1e0);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::ostringstream::~ostringstream(local_1b0);
            return false;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](args,(ulong)local_38);
          _i = (char *)std::__cxx11::string::c_str();
        }
        local_34 = 0;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool
cmFileCommand::HandleRPathCheckCommand(std::vector<std::string> const& args)
{
  // Evaluate arguments.
  const char* file = 0;
  const char* rpath = 0;
  enum Doing { DoingNone, DoingFile, DoingRPath };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "RPATH")
      {
      doing = DoingRPath;
      }
    else if(args[i] == "FILE")
      {
      doing = DoingFile;
      }
    else if(doing == DoingFile)
      {
      file = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingRPath)
      {
      rpath = args[i].c_str();
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "RPATH_CHECK given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
      }
    }
  if(!file)
    {
    this->SetError("RPATH_CHECK not given FILE option.");
    return false;
    }
  if(!rpath)
    {
    this->SetError("RPATH_CHECK not given RPATH option.");
    return false;
    }

  // If the file exists but does not have the desired RPath then
  // delete it.  This is used during installation to re-install a file
  // if its RPath will change.
  if(cmSystemTools::FileExists(file, true) &&
     !cmSystemTools::CheckRPath(file, rpath))
    {
    cmSystemTools::RemoveFile(file);
    }

  return true;
}